

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Abc_Ntk_t * Abc_SclBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pFanin;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *__s;
  Abc_Obj_t *pAVar7;
  Abc_Ntk_t *pAVar8;
  uint uVar9;
  int iVar10;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  ulong uVar11;
  long lVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                  ,0xcd,"Abc_Ntk_t *Abc_SclBufferPhase(Abc_Ntk_t *, int)");
  }
  pVVar13 = pNtk->vObjs;
  uVar1 = pVVar13->nSize;
  uVar4 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar4 = uVar1;
  }
  uVar6 = 0;
  if (uVar4 != 0) {
    __s = malloc((long)(int)uVar4 << 2);
    in_EDX = extraout_EDX;
    if (__s != (void *)0x0) {
      memset(__s,0,(long)(int)uVar1 * 4);
      in_EDX = extraout_EDX_00;
      goto LAB_00459cdd;
    }
  }
  __s = (void *)0x0;
LAB_00459cdd:
  if ((int)uVar1 < 1) {
    dVar15 = 0.0;
    dVar16 = 0.0;
  }
  else {
    uVar11 = 0;
    iVar10 = 0;
    iVar14 = 0;
    uVar6 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar13->pArray[uVar11];
      if (((pObj != (Abc_Obj_t *)0x0) && (uVar4 = *(uint *)&pObj->field_0x14 & 0xf, uVar4 < 8)) &&
         ((0x98U >> uVar4 & 1) != 0)) {
        if ((ulong)(long)(int)uVar1 <= uVar11) break;
        iVar5 = (pObj->vFanins).nSize;
        if (0 < iVar5) {
          lVar12 = 0;
          do {
            pVVar3 = pObj->pNtk->vPhases;
            if (pVVar3 == (Vec_Int_t *)0x0) {
              __assert_fail("p->pNtk->vPhases",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                            ,0x18a,"int Abc_ObjFaninPhase(Abc_Obj_t *, int)");
            }
            iVar2 = pObj->Id;
            if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) goto LAB_00459f27;
            if (((uint)pVVar3->pArray[iVar2] >> ((uint)lVar12 & 0x1f) & 1) != 0) {
              pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
              uVar4 = pFanin->Id;
              if (((long)(int)uVar4 < 0) || ((int)uVar1 <= (int)uVar4)) {
LAB_00459f27:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if ((*(int *)((long)__s + (long)(int)uVar4 * 4) == 0) ||
                 ((uVar9 = *(uint *)&pFanin->field_0x14 & 0xf, uVar9 == 5 || (uVar9 == 2)))) {
                pAVar7 = Abc_NtkCreateNodeInv(pNtk,pFanin);
                uVar4 = pFanin->Id;
                if (((long)(int)uVar4 < 0) || (uVar1 <= uVar4)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                *(int *)((long)__s + (long)(int)uVar4 * 4) = pAVar7->Id;
                uVar6 = uVar6 + 1;
                uVar4 = pFanin->Id;
              }
              if (((int)uVar4 < 0) || (uVar1 <= uVar4)) goto LAB_00459f27;
              iVar5 = *(int *)((long)__s + (ulong)uVar4 * 4);
              if (((long)iVar5 < 0) || (pNtk->vObjs->nSize <= iVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              Abc_ObjPatchFanin(pObj,pFanin,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar5]);
              iVar14 = iVar14 + 1;
              iVar5 = (pObj->vFanins).nSize;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar5);
          pVVar13 = pNtk->vObjs;
          iVar10 = iVar10 + (int)lVar12;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)pVVar13->nSize);
    in_EDX = (int)uVar11;
    dVar16 = (double)iVar10;
    dVar15 = (double)iVar14 * 100.0;
  }
  if (fVerbose != 0) {
    printf("Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n",
           ((double)(int)uVar6 * 100.0) / dVar16,dVar15 / dVar16,(ulong)uVar6);
    in_EDX = extraout_EDX_01;
  }
  if (__s != (void *)0x0) {
    free(__s);
    in_EDX = extraout_EDX_02;
  }
  Vec_IntFillExtra(pNtk->vPhases,pNtk->vObjs->nSize,in_EDX);
  pVVar3 = pNtk->vPhases;
  pNtk->vPhases = (Vec_Int_t *)0x0;
  pAVar8 = Abc_NtkDupDfs(pNtk);
  pNtk->vPhases = pVVar3;
  return pAVar8;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vInvs;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int nNodesOld = Abc_NtkObjNumMax(pNtk);
    int i, k, Counter = 0, Counter2 = 0, Total = 0;
    assert( pNtk->vPhases != NULL );
    vInvs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            if ( !Abc_ObjFaninPhase(pObj, k) )
                continue;
            if ( Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) == 0 || Abc_ObjIsCi(pFanin) ) // allow PIs to have high fanout - to be fixed later
            {
                pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFanin );
                Vec_IntWriteEntry( vInvs, Abc_ObjId(pFanin), Abc_ObjId(pFaninNew) );
                Counter++;
            }
            pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) );
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            Counter2++;
        }
    }
    if ( fVerbose )
        printf( "Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n", 
            Counter, 100.0 * Counter / Total, 100.0 * Counter2 / Total );
    Vec_IntFree( vInvs );
    Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    // duplicate network in topo order
    vInvs = pNtk->vPhases;
    pNtk->vPhases = NULL;
    pNtkNew = Abc_NtkDupDfs( pNtk );
    pNtk->vPhases = vInvs;
    return pNtkNew;
}